

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

ON_2dPoint __thiscall ON_OBSOLETE_V5_Annotation::Point(ON_OBSOLETE_V5_Annotation *this,int idx)

{
  ON_2dPoint *pOVar1;
  ON_2dPoint OVar2;
  ON_2dPoint local_18;
  
  if ((idx < 0) || ((this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count <= idx)) {
    ON_2dPoint::ON_2dPoint(&local_18,0.0,0.0);
  }
  else {
    pOVar1 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a + (uint)idx;
    local_18.x = pOVar1->x;
    local_18.y = pOVar1->y;
  }
  OVar2.y = local_18.y;
  OVar2.x = local_18.x;
  return OVar2;
}

Assistant:

ON_2dPoint ON_OBSOLETE_V5_Annotation::Point( int idx ) const
{
  return ( idx >= 0 && idx < m_points.Count() ) 
         ? m_points[idx] 
         : ON_2dPoint( 0.0, 0.0 );
}